

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode create_conn(Curl_easy *data,connectdata **in_connect,_Bool *async)

{
  _Bool _Var1;
  int iVar2;
  connectdata *pcVar3;
  char *pcVar4;
  long lVar5;
  size_t sVar6;
  connectbundle *bundle_00;
  undefined8 local_d8;
  undefined8 local_d0;
  connectdata *conn_candidate_1;
  connectdata *conn_candidate;
  connectbundle *bundle;
  size_t pipelen;
  char *pcStack_88;
  _Bool done;
  char *path_q_sep;
  char *ch_lower;
  char *reurl;
  size_t max_total_connections;
  size_t max_host_connections;
  _Bool waitpipe;
  _Bool force_reuse;
  _Bool connections_available;
  _Bool prot_missing;
  char *pcStack_58;
  _Bool reuse;
  char *options;
  char *passwd;
  char *user;
  size_t urllen;
  connectdata *conn_temp;
  connectdata *conn;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *async_local;
  connectdata **in_connect_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  urllen = 0;
  passwd = (char *)0x0;
  options = (char *)0x0;
  pcStack_58 = (char *)0x0;
  max_host_connections._6_1_ = 0;
  max_host_connections._5_1_ = 1;
  max_host_connections._4_1_ = 0;
  max_host_connections._3_1_ = 0;
  p_Stack_20 = async;
  async_local = (_Bool *)in_connect;
  in_connect_local = (connectdata **)data;
  max_total_connections = Curl_multi_max_host_connections(data->multi);
  reurl = (char *)Curl_multi_max_total_connections((Curl_multi *)in_connect_local[0x15]);
  *p_Stack_20 = false;
  if (in_connect_local[0x153] == (connectdata *)0x0) {
    conn._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    conn_temp = allocate_conn((Curl_easy *)in_connect_local);
    if (conn_temp == (connectdata *)0x0) {
      conn._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      *(connectdata **)async_local = conn_temp;
      user = (char *)strlen((char *)in_connect_local[0x153]);
      if (user < (char *)0x100) {
        user = (char *)0x100;
      }
      (*Curl_cfree)(in_connect_local[0xa12]);
      in_connect_local[0xa12] = (connectdata *)0x0;
      in_connect_local[0xa13] = (connectdata *)0x0;
      pcVar3 = (connectdata *)(*Curl_cmalloc)((size_t)(user + 2));
      in_connect_local[0xa12] = pcVar3;
      if (in_connect_local[0xa12] == (connectdata *)0x0) {
        conn._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        in_connect_local[0xa13] = in_connect_local[0xa12];
        pcVar4 = (char *)(*Curl_cmalloc)((size_t)(user + 2));
        (conn_temp->host).rawalloc = pcVar4;
        if ((conn_temp->host).rawalloc == (char *)0x0) {
          (*Curl_cfree)(in_connect_local[0xa12]);
          in_connect_local[0xa12] = (connectdata *)0x0;
          in_connect_local[0xa13] = (connectdata *)0x0;
          conn._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          (conn_temp->host).name = (conn_temp->host).rawalloc;
          *(conn_temp->host).name = '\0';
          passwd = (*Curl_cstrdup)("");
          options = (*Curl_cstrdup)("");
          pcStack_58 = (*Curl_cstrdup)("");
          if (((passwd == (char *)0x0) || (options == (char *)0x0)) || (pcStack_58 == (char *)0x0))
          {
            conn._4_4_ = CURLE_OUT_OF_MEMORY;
          }
          else {
            conn._4_4_ = parseurlandfillconn((Curl_easy *)in_connect_local,conn_temp,
                                             (_Bool *)((long)&max_host_connections + 6),&passwd,
                                             &options,&stack0xffffffffffffffa8);
            if (conn._4_4_ == CURLE_OK) {
              if ((max_host_connections._6_1_ & 1) != 0) {
                ch_lower = curl_maprintf("%s://%s",conn_temp->handler->scheme,
                                         in_connect_local[0x153]);
                pcVar4 = ch_lower;
                if (ch_lower == (char *)0x0) {
                  conn._4_4_ = CURLE_OUT_OF_MEMORY;
                  goto LAB_00125bf0;
                }
                while (path_q_sep = pcVar4, *path_q_sep != ':') {
                  iVar2 = tolower((uint)(byte)*path_q_sep);
                  *path_q_sep = (char)iVar2;
                  pcVar4 = path_q_sep + 1;
                }
                if (((ulong)in_connect_local[0x154] & 1) != 0) {
                  (*Curl_cfree)(in_connect_local[0x153]);
                  in_connect_local[0x153] = (connectdata *)0x0;
                  *(undefined1 *)(in_connect_local + 0x154) = 0;
                }
                in_connect_local[0x153] = (connectdata *)ch_lower;
                *(undefined1 *)(in_connect_local + 0x154) = 1;
              }
              if (((conn_temp->given->flags & 0x40) != 0) &&
                 (pcStack_88 = strchr((conn_temp->data->state).path,0x3f), pcStack_88 != (char *)0x0
                 )) {
                *pcStack_88 = '\0';
              }
              if (in_connect_local[0x133] != (connectdata *)0x0) {
                pcVar4 = (*Curl_cstrdup)((char *)in_connect_local[0x133]);
                conn_temp->oauth_bearer = pcVar4;
                if (conn_temp->oauth_bearer == (char *)0x0) {
                  conn._4_4_ = CURLE_OUT_OF_MEMORY;
                  goto LAB_00125bf0;
                }
              }
              if (in_connect_local[0x134] != (connectdata *)0x0) {
                pcVar4 = (*Curl_cstrdup)((char *)in_connect_local[0x134]);
                conn_temp->unix_domain_socket = pcVar4;
                if (conn_temp->unix_domain_socket == (char *)0x0) {
                  conn._4_4_ = CURLE_OUT_OF_MEMORY;
                  goto LAB_00125bf0;
                }
                conn_temp->abstract_unix_socket = (_Bool)(*(byte *)(in_connect_local + 0x150) & 1);
              }
              conn._4_4_ = create_conn_helper_init_proxy(conn_temp);
              if (conn._4_4_ == CURLE_OK) {
                if (((conn_temp->given->flags & 1) != 0) &&
                   (((conn_temp->bits).httpproxy & 1U) != 0)) {
                  (conn_temp->bits).tunnel_proxy = true;
                }
                conn._4_4_ = parse_remote_port((Curl_easy *)in_connect_local,conn_temp);
                if (((((((conn._4_4_ == CURLE_OK) &&
                        (conn._4_4_ = override_login((Curl_easy *)in_connect_local,conn_temp,&passwd
                                                     ,&options,&stack0xffffffffffffffa8),
                        conn._4_4_ == CURLE_OK)) &&
                       (conn._4_4_ = set_login(conn_temp,passwd,options,pcStack_58),
                       conn._4_4_ == CURLE_OK)) &&
                      ((conn._4_4_ = parse_connect_to_slist
                                               ((Curl_easy *)in_connect_local,conn_temp,
                                                (curl_slist *)in_connect_local[0xb7]),
                       conn._4_4_ == CURLE_OK &&
                       (conn._4_4_ = fix_hostname(conn_temp,&conn_temp->host),
                       conn._4_4_ == CURLE_OK)))) &&
                     ((((conn_temp->bits).conn_to_host & 1U) == 0 ||
                      (conn._4_4_ = fix_hostname(conn_temp,&conn_temp->conn_to_host),
                      conn._4_4_ == CURLE_OK)))) &&
                    ((conn._4_4_ = 0, ((conn_temp->bits).httpproxy & 1U) == 0 ||
                     (conn._4_4_ = fix_hostname(conn_temp,&(conn_temp->http_proxy).host),
                     conn._4_4_ == CURLE_OK)))) &&
                   ((conn._4_4_ = 0, ((conn_temp->bits).socksproxy & 1U) == 0 ||
                    (conn._4_4_ = fix_hostname(conn_temp,&(conn_temp->socks_proxy).host),
                    conn._4_4_ == CURLE_OK)))) {
                  conn._4_4_ = 0;
                  if ((((conn_temp->bits).conn_to_host & 1U) != 0) &&
                     (iVar2 = Curl_strcasecompare((conn_temp->conn_to_host).name,
                                                  (conn_temp->host).name), iVar2 != 0)) {
                    (conn_temp->bits).conn_to_host = false;
                  }
                  if ((((conn_temp->bits).conn_to_port & 1U) != 0) &&
                     (conn_temp->conn_to_port == conn_temp->remote_port)) {
                    (conn_temp->bits).conn_to_port = false;
                  }
                  if (((((conn_temp->bits).conn_to_host & 1U) != 0) ||
                      (((conn_temp->bits).conn_to_port & 1U) != 0)) &&
                     (((conn_temp->bits).httpproxy & 1U) != 0)) {
                    (conn_temp->bits).tunnel_proxy = true;
                  }
                  conn._4_4_ = setup_connection_internals(conn_temp);
                  if (conn._4_4_ == CURLE_OK) {
                    conn_temp->recv[0] = Curl_recv_plain;
                    conn_temp->send[0] = Curl_send_plain;
                    conn_temp->recv[1] = Curl_recv_plain;
                    conn_temp->send[1] = Curl_send_plain;
                    (conn_temp->bits).tcp_fastopen =
                         (_Bool)(*(byte *)(in_connect_local + 0x147) & 1);
                    if ((conn_temp->handler->flags & 0x10) == 0) {
                      in_connect_local[0xc0] = in_connect_local[0x118];
                      in_connect_local[0xd5] = in_connect_local[0x119];
                      in_connect_local[0xc1] = in_connect_local[0x11a];
                      in_connect_local[0xd6] = in_connect_local[0x11b];
                      in_connect_local[0xc3] = in_connect_local[0x121];
                      in_connect_local[0xd8] = in_connect_local[0x121];
                      in_connect_local[0xc4] = in_connect_local[0x120];
                      in_connect_local[0xd9] = in_connect_local[0x120];
                      in_connect_local[0xc5] = in_connect_local[0x11e];
                      in_connect_local[0xda] = in_connect_local[0x11f];
                      in_connect_local[200] = in_connect_local[0x123];
                      in_connect_local[0xdd] = in_connect_local[0x124];
                      in_connect_local[0xc9] = in_connect_local[0x125];
                      in_connect_local[0xde] = in_connect_local[0x126];
                      in_connect_local[0xcd] = in_connect_local[0xfe];
                      in_connect_local[0xe2] = in_connect_local[0xff];
                      in_connect_local[0xce] = in_connect_local[0x100];
                      in_connect_local[0xe3] = in_connect_local[0x101];
                      in_connect_local[0xcf] = in_connect_local[0x10b];
                      in_connect_local[0xe4] = in_connect_local[0x10c];
                      in_connect_local[0xd0] = in_connect_local[0x10f];
                      in_connect_local[0xe5] = in_connect_local[0x110];
                      in_connect_local[0xd1] = in_connect_local[0x10d];
                      in_connect_local[0xe6] = in_connect_local[0x10e];
                      in_connect_local[0xc2] = in_connect_local[0xfe];
                      in_connect_local[0xd7] = in_connect_local[0xff];
                      _Var1 = Curl_clone_primary_ssl_config
                                        ((ssl_primary_config *)(in_connect_local + 0xbd),
                                         &conn_temp->ssl_config);
                      if (_Var1) {
                        _Var1 = Curl_clone_primary_ssl_config
                                          ((ssl_primary_config *)(in_connect_local + 0xd2),
                                           &conn_temp->proxy_ssl_config);
                        if (_Var1) {
                          prune_dead_connections((Curl_easy *)in_connect_local);
                          if (((*(byte *)((long)in_connect_local + 0x7ab) & 1) == 0) ||
                             (((ulong)in_connect_local[0x997] & 1) != 0)) {
                            max_host_connections._7_1_ =
                                 ConnectionExists((Curl_easy *)in_connect_local,conn_temp,
                                                  (connectdata **)&urllen,
                                                  (_Bool *)((long)&max_host_connections + 4),
                                                  (_Bool *)((long)&max_host_connections + 3));
                          }
                          else {
                            max_host_connections._7_1_ = false;
                          }
                          if ((((_Bool)max_host_connections._7_1_ != false) &&
                              ((max_host_connections._4_1_ & 1) == 0)) &&
                             ((iVar2 = IsPipeliningPossible
                                                 ((Curl_easy *)in_connect_local,
                                                  (connectdata *)urllen), iVar2 != 0 &&
                              (lVar5 = *(long *)(urllen + 0x460) + *(long *)(urllen + 0x480),
                              lVar5 != 0)))) {
                            Curl_infof((Curl_easy *)in_connect_local,
                                       "Found connection %ld, with requests in the pipe (%zu)\n",
                                       *(undefined8 *)(urllen + 0x68),lVar5);
                            sVar6 = Curl_conncache_bundle_size((connectdata *)urllen);
                            if ((sVar6 < max_total_connections) &&
                               (pcVar4 = (char *)Curl_conncache_size((Curl_easy *)in_connect_local),
                               pcVar4 < reurl)) {
                              max_host_connections._7_1_ = 0;
                              Curl_infof((Curl_easy *)in_connect_local,
                                         "We can reuse, but we want a new connection anyway\n");
                              Curl_conncache_return_conn((connectdata *)urllen);
                            }
                          }
                          if ((max_host_connections._7_1_ & 1) == 0) {
                            if ((conn_temp->handler->flags & 0x100) != 0) {
                              if ((*(byte *)((long)in_connect_local + 0xa49) & 1) != 0) {
                                (conn_temp->bits).tls_enable_alpn = true;
                              }
                              if (((ulong)in_connect_local[0x149] & 1) != 0) {
                                (conn_temp->bits).tls_enable_npn = true;
                              }
                            }
                            if ((max_host_connections._3_1_ & 1) == 0) {
                              bundle_00 = Curl_conncache_find_bundle
                                                    (conn_temp,(conncache *)in_connect_local[0x18d])
                              ;
                              if (((max_total_connections == 0) ||
                                  (bundle_00 == (connectbundle *)0x0)) ||
                                 (bundle_00->num_connections < max_total_connections)) {
                                Curl_conncache_unlock(conn_temp);
                              }
                              else {
                                pcVar3 = Curl_conncache_extract_bundle
                                                   ((Curl_easy *)in_connect_local,bundle_00);
                                Curl_conncache_unlock(conn_temp);
                                if (pcVar3 == (connectdata *)0x0) {
                                  Curl_infof((Curl_easy *)in_connect_local,
                                             "No more connections allowed to host: %d\n",
                                             max_total_connections);
                                  max_host_connections._5_1_ = 0;
                                }
                                else {
                                  pcVar3->data = (Curl_easy *)in_connect_local;
                                  Curl_disconnect(pcVar3,false);
                                }
                              }
                            }
                            else {
                              max_host_connections._5_1_ = 0;
                            }
                            if ((((max_host_connections._5_1_ & 1) != 0) && (reurl != (char *)0x0))
                               && (pcVar4 = (char *)Curl_conncache_size((Curl_easy *)
                                                                        in_connect_local),
                                  reurl <= pcVar4)) {
                              pcVar3 = Curl_conncache_extract_oldest((Curl_easy *)in_connect_local);
                              if (pcVar3 == (connectdata *)0x0) {
                                Curl_infof((Curl_easy *)in_connect_local,
                                           "No connections available in cache\n");
                                max_host_connections._5_1_ = 0;
                              }
                              else {
                                pcVar3->data = (Curl_easy *)in_connect_local;
                                Curl_disconnect(pcVar3,false);
                              }
                            }
                            if ((max_host_connections._5_1_ & 1) == 0) {
                              Curl_infof((Curl_easy *)in_connect_local,"No connections available.\n"
                                        );
                              conn_free(conn_temp);
                              async_local[0] = false;
                              async_local[1] = false;
                              async_local[2] = false;
                              async_local[3] = false;
                              async_local[4] = false;
                              async_local[5] = false;
                              async_local[6] = false;
                              async_local[7] = false;
                              conn._4_4_ = CURLE_NO_CONNECTION_AVAILABLE;
                              goto LAB_00125bf0;
                            }
                            conn_temp->inuse = true;
                            Curl_conncache_add_conn((conncache *)in_connect_local[0x18d],conn_temp);
                            if ((((ulong)in_connect_local[0x9bb] & 0x28) != 0) &&
                               (((ulong)in_connect_local[0x9bd] & 1) != 0)) {
                              Curl_infof((Curl_easy *)in_connect_local,
                                         "NTLM picked AND auth done set, clear picked!\n");
                              in_connect_local[0x9bb] = (connectdata *)0x0;
                              *(undefined1 *)(in_connect_local + 0x9bd) = 0;
                            }
                            if ((((ulong)in_connect_local[0x9bf] & 0x28) != 0) &&
                               (((ulong)in_connect_local[0x9c1] & 1) != 0)) {
                              Curl_infof((Curl_easy *)in_connect_local,
                                         "NTLM-proxy picked AND auth done set, clear picked!\n");
                              in_connect_local[0x9bf] = (connectdata *)0x0;
                              *(undefined1 *)(in_connect_local + 0x9c1) = 0;
                            }
                          }
                          else {
                            reuse_conn(conn_temp,(connectdata *)urllen);
                            (*Curl_cfree)(conn_temp->ssl_extra);
                            (*Curl_cfree)(conn_temp);
                            conn_temp = (connectdata *)urllen;
                            *(size_t *)async_local = urllen;
                            pcVar4 = "host";
                            if ((*(byte *)(urllen + 0x38d) & 1) != 0) {
                              pcVar4 = "proxy";
                            }
                            if (*(long *)(urllen + 0x120) == 0) {
                              if (*(long *)(urllen + 0x160) == 0) {
                                local_d8 = *(undefined8 *)(urllen + 0xe0);
                              }
                              else {
                                local_d8 = *(undefined8 *)(urllen + 0x168);
                              }
                              local_d0 = local_d8;
                            }
                            else {
                              local_d0 = *(undefined8 *)(urllen + 0x128);
                            }
                            Curl_infof((Curl_easy *)in_connect_local,
                                       "Re-using existing connection! (#%ld) with %s %s\n",
                                       *(undefined8 *)(urllen + 0x68),pcVar4,local_d0);
                          }
                          Curl_init_do((Curl_easy *)in_connect_local,conn_temp);
                          conn._4_4_ = setup_range((Curl_easy *)in_connect_local);
                          if (conn._4_4_ == CURLE_OK) {
                            conn_temp->seek_func = (curl_seek_callback)in_connect_local[0x4e];
                            conn_temp->seek_client = in_connect_local[0x60];
                            conn._4_4_ = resolve_server((Curl_easy *)in_connect_local,conn_temp,
                                                        p_Stack_20);
                          }
                        }
                        else {
                          conn._4_4_ = CURLE_OUT_OF_MEMORY;
                        }
                      }
                      else {
                        conn._4_4_ = CURLE_OUT_OF_MEMORY;
                      }
                    }
                    else {
                      conn._4_4_ = (*conn_temp->handler->connect_it)
                                             (conn_temp,(_Bool *)((long)&pipelen + 7));
                      if (conn._4_4_ == CURLE_OK) {
                        conn_temp->data = (Curl_easy *)in_connect_local;
                        (conn_temp->bits).tcpconnect[0] = true;
                        Curl_conncache_add_conn((conncache *)in_connect_local[0x18d],conn_temp);
                        conn._4_4_ = setup_range((Curl_easy *)in_connect_local);
                        if (conn._4_4_ != CURLE_OK) {
                          (*conn_temp->handler->done)(conn_temp,conn._4_4_,false);
                          goto LAB_00125bf0;
                        }
                        Curl_setup_transfer(conn_temp,-1,-1,false,(curl_off_t *)0x0,-1,
                                            (curl_off_t *)0x0);
                      }
                      Curl_init_do((Curl_easy *)in_connect_local,conn_temp);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00125bf0:
  (*Curl_cfree)(pcStack_58);
  (*Curl_cfree)(options);
  (*Curl_cfree)(passwd);
  return conn._4_4_;
}

Assistant:

static CURLcode create_conn(struct Curl_easy *data,
                            struct connectdata **in_connect,
                            bool *async)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn;
  struct connectdata *conn_temp = NULL;
  size_t urllen;
  char *user = NULL;
  char *passwd = NULL;
  char *options = NULL;
  bool reuse;
  bool prot_missing = FALSE;
  bool connections_available = TRUE;
  bool force_reuse = FALSE;
  bool waitpipe = FALSE;
  size_t max_host_connections = Curl_multi_max_host_connections(data->multi);
  size_t max_total_connections = Curl_multi_max_total_connections(data->multi);

  *async = FALSE;

  /*************************************************************
   * Check input data
   *************************************************************/

  if(!data->change.url) {
    result = CURLE_URL_MALFORMAT;
    goto out;
  }

  /* First, split up the current URL in parts so that we can use the
     parts for checking against the already present connections. In order
     to not have to modify everything at once, we allocate a temporary
     connection data struct and fill in for comparison purposes. */
  conn = allocate_conn(data);

  if(!conn) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  /* We must set the return variable as soon as possible, so that our
     parent can cleanup any possible allocs we may have done before
     any failure */
  *in_connect = conn;

  /* This initing continues below, see the comment "Continue connectdata
   * initialization here" */

  /***********************************************************
   * We need to allocate memory to store the path in. We get the size of the
   * full URL to be sure, and we need to make it at least 256 bytes since
   * other parts of the code will rely on this fact
   ***********************************************************/
#define LEAST_PATH_ALLOC 256
  urllen = strlen(data->change.url);
  if(urllen < LEAST_PATH_ALLOC)
    urllen = LEAST_PATH_ALLOC;

  /*
   * We malloc() the buffers below urllen+2 to make room for 2 possibilities:
   * 1 - an extra terminating zero
   * 2 - an extra slash (in case a syntax like "www.host.com?moo" is used)
   */

  Curl_safefree(data->state.pathbuffer);
  data->state.path = NULL;

  data->state.pathbuffer = malloc(urllen + 2);
  if(NULL == data->state.pathbuffer) {
    result = CURLE_OUT_OF_MEMORY; /* really bad error */
    goto out;
  }
  data->state.path = data->state.pathbuffer;

  conn->host.rawalloc = malloc(urllen + 2);
  if(NULL == conn->host.rawalloc) {
    Curl_safefree(data->state.pathbuffer);
    data->state.path = NULL;
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  conn->host.name = conn->host.rawalloc;
  conn->host.name[0] = 0;

  user = strdup("");
  passwd = strdup("");
  options = strdup("");
  if(!user || !passwd || !options) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  result = parseurlandfillconn(data, conn, &prot_missing, &user, &passwd,
                               &options);
  if(result)
    goto out;

  /*************************************************************
   * No protocol part in URL was used, add it!
   *************************************************************/
  if(prot_missing) {
    /* We're guessing prefixes here and if we're told to use a proxy or if
       we're going to follow a Location: later or... then we need the protocol
       part added so that we have a valid URL. */
    char *reurl;
    char *ch_lower;

    reurl = aprintf("%s://%s", conn->handler->scheme, data->change.url);

    if(!reurl) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }

    /* Change protocol prefix to lower-case */
    for(ch_lower = reurl; *ch_lower != ':'; ch_lower++)
      *ch_lower = (char)TOLOWER(*ch_lower);

    if(data->change.url_alloc) {
      Curl_safefree(data->change.url);
      data->change.url_alloc = FALSE;
    }

    data->change.url = reurl;
    data->change.url_alloc = TRUE; /* free this later */
  }

  /*************************************************************
   * If the protocol can't handle url query strings, then cut
   * off the unhandable part
   *************************************************************/
  if((conn->given->flags&PROTOPT_NOURLQUERY)) {
    char *path_q_sep = strchr(conn->data->state.path, '?');
    if(path_q_sep) {
      /* according to rfc3986, allow the query (?foo=bar)
         also on protocols that can't handle it.

         cut the string-part after '?'
      */

      /* terminate the string */
      path_q_sep[0] = 0;
    }
  }

  if(data->set.str[STRING_BEARER]) {
    conn->oauth_bearer = strdup(data->set.str[STRING_BEARER]);
    if(!conn->oauth_bearer) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
  }

#ifdef USE_UNIX_SOCKETS
  if(data->set.str[STRING_UNIX_SOCKET_PATH]) {
    conn->unix_domain_socket = strdup(data->set.str[STRING_UNIX_SOCKET_PATH]);
    if(conn->unix_domain_socket == NULL) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }
    conn->abstract_unix_socket = data->set.abstract_unix_socket;
  }
#endif

  /* After the unix socket init but before the proxy vars are used, parse and
     initialize the proxy vars */
#ifndef CURL_DISABLE_PROXY
  result = create_conn_helper_init_proxy(conn);
  if(result)
    goto out;
#endif

  /*************************************************************
   * If the protocol is using SSL and HTTP proxy is used, we set
   * the tunnel_proxy bit.
   *************************************************************/
  if((conn->given->flags&PROTOPT_SSL) && conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Figure out the remote port number and fix it in the URL
   *************************************************************/
  result = parse_remote_port(data, conn);
  if(result)
    goto out;

  /* Check for overridden login details and set them accordingly so they
     they are known when protocol->setup_connection is called! */
  result = override_login(data, conn, &user, &passwd, &options);
  if(result)
    goto out;
  result = set_login(conn, user, passwd, options);
  if(result)
    goto out;

  /*************************************************************
   * Process the "connect to" linked list of hostname/port mappings.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  result = parse_connect_to_slist(data, conn, data->set.connect_to);
  if(result)
    goto out;

  /*************************************************************
   * IDN-fix the hostnames
   *************************************************************/
  result = fix_hostname(conn, &conn->host);
  if(result)
    goto out;
  if(conn->bits.conn_to_host) {
    result = fix_hostname(conn, &conn->conn_to_host);
    if(result)
      goto out;
  }
  if(conn->bits.httpproxy) {
    result = fix_hostname(conn, &conn->http_proxy.host);
    if(result)
      goto out;
  }
  if(conn->bits.socksproxy) {
    result = fix_hostname(conn, &conn->socks_proxy.host);
    if(result)
      goto out;
  }

  /*************************************************************
   * Check whether the host and the "connect to host" are equal.
   * Do this after the hostnames have been IDN-fixed.
   *************************************************************/
  if(conn->bits.conn_to_host &&
     strcasecompare(conn->conn_to_host.name, conn->host.name)) {
    conn->bits.conn_to_host = FALSE;
  }

  /*************************************************************
   * Check whether the port and the "connect to port" are equal.
   * Do this after the remote port number has been fixed in the URL.
   *************************************************************/
  if(conn->bits.conn_to_port && conn->conn_to_port == conn->remote_port) {
    conn->bits.conn_to_port = FALSE;
  }

  /*************************************************************
   * If the "connect to" feature is used with an HTTP proxy,
   * we set the tunnel_proxy bit.
   *************************************************************/
  if((conn->bits.conn_to_host || conn->bits.conn_to_port) &&
      conn->bits.httpproxy)
    conn->bits.tunnel_proxy = TRUE;

  /*************************************************************
   * Setup internals depending on protocol. Needs to be done after
   * we figured out what/if proxy to use.
   *************************************************************/
  result = setup_connection_internals(conn);
  if(result)
    goto out;

  conn->recv[FIRSTSOCKET] = Curl_recv_plain;
  conn->send[FIRSTSOCKET] = Curl_send_plain;
  conn->recv[SECONDARYSOCKET] = Curl_recv_plain;
  conn->send[SECONDARYSOCKET] = Curl_send_plain;

  conn->bits.tcp_fastopen = data->set.tcp_fastopen;

  /***********************************************************************
   * file: is a special case in that it doesn't need a network connection
   ***********************************************************************/
#ifndef CURL_DISABLE_FILE
  if(conn->handler->flags & PROTOPT_NONETWORK) {
    bool done;
    /* this is supposed to be the connect function so we better at least check
       that the file is present here! */
    DEBUGASSERT(conn->handler->connect_it);
    result = conn->handler->connect_it(conn, &done);

    /* Setup a "faked" transfer that'll do nothing */
    if(!result) {
      conn->data = data;
      conn->bits.tcpconnect[FIRSTSOCKET] = TRUE; /* we are "connected */

      Curl_conncache_add_conn(data->state.conn_cache, conn);

      /*
       * Setup whatever necessary for a resumed transfer
       */
      result = setup_range(data);
      if(result) {
        DEBUGASSERT(conn->handler->done);
        /* we ignore the return code for the protocol-specific DONE */
        (void)conn->handler->done(conn, result, FALSE);
        goto out;
      }

      Curl_setup_transfer(conn, -1, -1, FALSE, NULL, /* no download */
                          -1, NULL); /* no upload */
    }

    /* since we skip do_init() */
    Curl_init_do(data, conn);

    goto out;
  }
#endif

  /* Get a cloned copy of the SSL config situation stored in the
     connection struct. But to get this going nicely, we must first make
     sure that the strings in the master copy are pointing to the correct
     strings in the session handle strings array!

     Keep in mind that the pointers in the master copy are pointing to strings
     that will be freed as part of the Curl_easy struct, but all cloned
     copies will be separately allocated.
  */
  data->set.ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_ORIG];
  data->set.proxy_ssl.primary.CApath = data->set.str[STRING_SSL_CAPATH_PROXY];
  data->set.ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_ORIG];
  data->set.proxy_ssl.primary.CAfile = data->set.str[STRING_SSL_CAFILE_PROXY];
  data->set.ssl.primary.random_file = data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.proxy_ssl.primary.random_file =
    data->set.str[STRING_SSL_RANDOM_FILE];
  data->set.ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.proxy_ssl.primary.egdsocket = data->set.str[STRING_SSL_EGDSOCKET];
  data->set.ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_ORIG];
  data->set.proxy_ssl.primary.cipher_list =
    data->set.str[STRING_SSL_CIPHER_LIST_PROXY];

  data->set.ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_ORIG];
  data->set.proxy_ssl.CRLfile = data->set.str[STRING_SSL_CRLFILE_PROXY];
  data->set.ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_ORIG];
  data->set.proxy_ssl.issuercert = data->set.str[STRING_SSL_ISSUERCERT_PROXY];
  data->set.ssl.cert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.cert = data->set.str[STRING_CERT_PROXY];
  data->set.ssl.cert_type = data->set.str[STRING_CERT_TYPE_ORIG];
  data->set.proxy_ssl.cert_type = data->set.str[STRING_CERT_TYPE_PROXY];
  data->set.ssl.key = data->set.str[STRING_KEY_ORIG];
  data->set.proxy_ssl.key = data->set.str[STRING_KEY_PROXY];
  data->set.ssl.key_type = data->set.str[STRING_KEY_TYPE_ORIG];
  data->set.proxy_ssl.key_type = data->set.str[STRING_KEY_TYPE_PROXY];
  data->set.ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_ORIG];
  data->set.proxy_ssl.key_passwd = data->set.str[STRING_KEY_PASSWD_PROXY];
  data->set.ssl.primary.clientcert = data->set.str[STRING_CERT_ORIG];
  data->set.proxy_ssl.primary.clientcert = data->set.str[STRING_CERT_PROXY];
#ifdef USE_TLS_SRP
  data->set.ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_ORIG];
  data->set.proxy_ssl.username = data->set.str[STRING_TLSAUTH_USERNAME_PROXY];
  data->set.ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_ORIG];
  data->set.proxy_ssl.password = data->set.str[STRING_TLSAUTH_PASSWORD_PROXY];
#endif

  if(!Curl_clone_primary_ssl_config(&data->set.ssl.primary,
     &conn->ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  if(!Curl_clone_primary_ssl_config(&data->set.proxy_ssl.primary,
                                    &conn->proxy_ssl_config)) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  prune_dead_connections(data);

  /*************************************************************
   * Check the current list of connections to see if we can
   * re-use an already existing one or if we have to create a
   * new one.
   *************************************************************/

  /* reuse_fresh is TRUE if we are told to use a new connection by force, but
     we only acknowledge this option if this is not a re-used connection
     already (which happens due to follow-location or during a HTTP
     authentication phase). */
  if(data->set.reuse_fresh && !data->state.this_is_a_follow)
    reuse = FALSE;
  else
    reuse = ConnectionExists(data, conn, &conn_temp, &force_reuse, &waitpipe);

  /* If we found a reusable connection that is now marked as in use, we may
     still want to open a new connection if we are pipelining. */
  if(reuse && !force_reuse && IsPipeliningPossible(data, conn_temp)) {
    size_t pipelen = conn_temp->send_pipe.size + conn_temp->recv_pipe.size;
    if(pipelen > 0) {
      infof(data, "Found connection %ld, with requests in the pipe (%zu)\n",
            conn_temp->connection_id, pipelen);

      if(Curl_conncache_bundle_size(conn_temp) < max_host_connections &&
         Curl_conncache_size(data) < max_total_connections) {
        /* We want a new connection anyway */
        reuse = FALSE;

        infof(data, "We can reuse, but we want a new connection anyway\n");
        Curl_conncache_return_conn(conn_temp);
      }
    }
  }

  if(reuse) {
    /*
     * We already have a connection for this, we got the former connection
     * in the conn_temp variable and thus we need to cleanup the one we
     * just allocated before we can move along and use the previously
     * existing one.
     */
    reuse_conn(conn, conn_temp);
#ifdef USE_SSL
    free(conn->ssl_extra);
#endif
    free(conn);          /* we don't need this anymore */
    conn = conn_temp;
    *in_connect = conn;

    infof(data, "Re-using existing connection! (#%ld) with %s %s\n",
          conn->connection_id,
          conn->bits.proxy?"proxy":"host",
          conn->socks_proxy.host.name ? conn->socks_proxy.host.dispname :
          conn->http_proxy.host.name ? conn->http_proxy.host.dispname :
                                       conn->host.dispname);
  }
  else {
    /* We have decided that we want a new connection. However, we may not
       be able to do that if we have reached the limit of how many
       connections we are allowed to open. */

    if(conn->handler->flags & PROTOPT_ALPN_NPN) {
      /* The protocol wants it, so set the bits if enabled in the easy handle
         (default) */
      if(data->set.ssl_enable_alpn)
        conn->bits.tls_enable_alpn = TRUE;
      if(data->set.ssl_enable_npn)
        conn->bits.tls_enable_npn = TRUE;
    }

    if(waitpipe)
      /* There is a connection that *might* become usable for pipelining
         "soon", and we wait for that */
      connections_available = FALSE;
    else {
      /* this gets a lock on the conncache */
      struct connectbundle *bundle =
        Curl_conncache_find_bundle(conn, data->state.conn_cache);

      if(max_host_connections > 0 && bundle &&
         (bundle->num_connections >= max_host_connections)) {
        struct connectdata *conn_candidate;

        /* The bundle is full. Extract the oldest connection. */
        conn_candidate = Curl_conncache_extract_bundle(data, bundle);
        Curl_conncache_unlock(conn);

        if(conn_candidate) {
          /* Set the connection's owner correctly, then kill it */
          conn_candidate->data = data;
          (void)Curl_disconnect(conn_candidate, /* dead_connection */ FALSE);
        }
        else {
          infof(data, "No more connections allowed to host: %d\n",
                max_host_connections);
          connections_available = FALSE;
        }
      }
      else
        Curl_conncache_unlock(conn);

    }

    if(connections_available &&
       (max_total_connections > 0) &&
       (Curl_conncache_size(data) >= max_total_connections)) {
      struct connectdata *conn_candidate;

      /* The cache is full. Let's see if we can kill a connection. */
      conn_candidate = Curl_conncache_extract_oldest(data);

      if(conn_candidate) {
        /* Set the connection's owner correctly, then kill it */
        conn_candidate->data = data;
        (void)Curl_disconnect(conn_candidate, /* dead_connection */ FALSE);
      }
      else {
        infof(data, "No connections available in cache\n");
        connections_available = FALSE;
      }
    }

    if(!connections_available) {
      infof(data, "No connections available.\n");

      conn_free(conn);
      *in_connect = NULL;

      result = CURLE_NO_CONNECTION_AVAILABLE;
      goto out;
    }
    else {
      /* Mark the connection as used, before we add it */
      conn->inuse = TRUE;

      /*
       * This is a brand new connection, so let's store it in the connection
       * cache of ours!
       */
      Curl_conncache_add_conn(data->state.conn_cache, conn);
    }

#if defined(USE_NTLM)
    /* If NTLM is requested in a part of this connection, make sure we don't
       assume the state is fine as this is a fresh connection and NTLM is
       connection based. */
    if((data->state.authhost.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authhost.done) {
      infof(data, "NTLM picked AND auth done set, clear picked!\n");
      data->state.authhost.picked = CURLAUTH_NONE;
      data->state.authhost.done = FALSE;
    }

    if((data->state.authproxy.picked & (CURLAUTH_NTLM | CURLAUTH_NTLM_WB)) &&
       data->state.authproxy.done) {
      infof(data, "NTLM-proxy picked AND auth done set, clear picked!\n");
      data->state.authproxy.picked = CURLAUTH_NONE;
      data->state.authproxy.done = FALSE;
    }
#endif
  }

  /* Setup and init stuff before DO starts, in preparing for the transfer. */
  Curl_init_do(data, conn);

  /*
   * Setup whatever necessary for a resumed transfer
   */
  result = setup_range(data);
  if(result)
    goto out;

  /* Continue connectdata initialization here. */

  /*
   * Inherit the proper values from the urldata struct AFTER we have arranged
   * the persistent connection stuff
   */
  conn->seek_func = data->set.seek_func;
  conn->seek_client = data->set.seek_client;

  /*************************************************************
   * Resolve the address of the server or proxy
   *************************************************************/
  result = resolve_server(data, conn, async);

out:

  free(options);
  free(passwd);
  free(user);
  return result;
}